

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O2

EC_T_DWORD
EtherCATStack(CAtEmLogging *poLog,EC_T_CNF_TYPE eCnfType,EC_T_PBYTE pbyCnfData,
             EC_T_DWORD dwCnfDataLen,EC_T_DWORD dwBusCycleTimeUsec,EC_T_INT nVerbose,
             EC_T_DWORD dwDuration,EC_T_LINK_PARMS *poLinkParms,void *pvTimingEvent,
             EC_T_DWORD dwCpuIndex,EC_T_BOOL bEnaPerfJobs,EC_T_WORD wServerPort,
             EC_T_LINK_PARMS *poLinkParmsRed,EC_T_OS_PARMS *poOsParms,EC_T_DCM_MODE eDcmMode,
             EC_T_BOOL bDcmCtlOff,_func_void_EC_T_BYTE_ptr_EC_T_BYTE_ptr *callbackFctPtr,
             char *licenseKey)

{
  bool bVar1;
  short sVar2;
  EC_T_DCM_MODE EVar3;
  EC_T_INT EVar4;
  int iVar5;
  EC_T_DCM_MODE EVar6;
  EC_T_DWORD EVar7;
  uint uVar8;
  int iVar9;
  EC_T_BOOL EVar10;
  EC_T_DWORD EVar11;
  EC_T_STATE EVar12;
  uint uVar13;
  CEmNotification *pCVar14;
  undefined8 uVar15;
  size_t sVar16;
  ulong uVar17;
  EC_T_CHAR *pEVar18;
  ulong extraout_RDX;
  EC_T_CFG_SLAVE_INFO *extraout_RDX_00;
  EC_T_CFG_SLAVE_INFO *extraout_RDX_01;
  EC_T_CFG_SLAVE_INFO *extraout_RDX_02;
  EC_T_CFG_SLAVE_INFO *extraout_RDX_03;
  EC_T_CFG_SLAVE_INFO *extraout_RDX_04;
  EC_T_CFG_SLAVE_INFO *extraout_RDX_05;
  EC_T_CFG_SLAVE_INFO *pEVar19;
  EC_T_CFG_SLAVE_INFO *pSlaveInfo;
  EC_T_CFG_SLAVE_INFO *pSlaveInfo_00;
  CAtEmLogging *pCVar20;
  char cVar21;
  EC_T_PBYTE puVar22;
  char *pcVar23;
  EC_T_DWORD *pEVar24;
  EC_T_DWORD dwTimeout;
  EC_T_DWORD in_stack_fffffffffffffe88;
  EC_T_DWORD dwSize;
  uint local_168;
  EC_T_WORD wOffsetTmp;
  undefined2 uStack_162;
  EC_T_INT nDiffAvg;
  EC_T_BYTE byNumElements;
  CAtEmLogging *local_158;
  CEmNotification *local_150;
  EC_T_PBYTE local_148;
  EC_T_CNF_TYPE local_140;
  EC_T_DWORD local_13c;
  EC_T_DCM_CONFIG oDcmConfig;
  CEcTimer oTimeout;
  byte local_98;
  CEcTimer oDcmStatusTimer;
  byte local_38;
  
  callbackFct = callbackFctPtr;
  local_148 = pbyCnfData;
  local_140 = eCnfType;
  local_13c = dwCnfDataLen;
  CEcTimer::CEcTimer(&oTimeout);
  CEcTimer::CEcTimer(&oDcmStatusTimer);
  local_168 = (dwBusCycleTimeUsec * 2) / 3;
  S_bEnaPerfJobs = bEnaPerfJobs;
  S_DemoThreadParam.pvTimingEvent = pvTimingEvent;
  S_poLog = poLog;
  CAtEmLogging::LogMsg(poLog,"nVerbose: %d\n",nVerbose);
  if (poLinkParms->eLinkMode != EcLinkMode_POLLING) {
    EVar12 = 0x1fd076;
    CAtEmLogging::LogError
              (S_poLog,
               "Error: Link layer in \'interrupt\' mode is not supported by EcMasterDemoDc. Please select \'polling\' mode."
              );
LAB_001446ef:
    EVar6 = 0x9811000b;
    pCVar14 = (CEmNotification *)0x0;
    goto LAB_001446f5;
  }
  iVar5 = OsSetThreadAffinity(0,1 << ((byte)dwCpuIndex & 0x1f));
  if (iVar5 == 0) {
    EVar12 = 0x1fd0de;
    CAtEmLogging::LogError
              (S_poLog,"Error: Set thread affinitiy, invalid CPU index %d\n",(ulong)dwCpuIndex);
    goto LAB_001446ef;
  }
  EVar12 = 0x246068;
  pCVar14 = (CEmNotification *)operator_new(0x7768,(nothrow_t *)&std::nothrow);
  if (pCVar14 == (CEmNotification *)0x0) {
    EVar6 = 0x9811000a;
    pCVar14 = (CEmNotification *)0x0;
    goto LAB_001446f5;
  }
  CEmNotification::CEmNotification(pCVar14,0,poLog,0);
  pCVar14->m_nVerbosePrinting = nVerbose;
  local_150 = pCVar14;
  if (S_bEnaPerfJobs != 0) {
    ecatPerfMeasInit(&S_TscMeasDesc,0,7,0);
    ecatPerfMeasEnable(&S_TscMeasDesc);
  }
  S_dwAppFoundSlaves = 0;
  memset(S_aSlaveList,0,0x4d8);
  S_dwSlaveIdx14 = 0xffff;
  S_dwSlaveIdx24 = 0xffff;
  S_dwSlaveIdx4132 = 0xffff;
  S_dwSlaveIdxETCio100 = 0xffff;
  if (wServerPort != 0xffff) {
    if (nVerbose != 0) {
      CAtEmLogging::LogMsg(S_poLog,"Start Remote API Server now\n");
    }
    iVar5 = emRasSrvStart(&S_pvRemoteApiSrvH);
    if (iVar5 != 0) {
      CAtEmLogging::LogError(S_poLog,"ERROR: Cannot spawn Remote API Server\n");
    }
    S_bRasSrvStarted = '\x01';
  }
  if (nVerbose != 0) {
    CAtEmLogging::LogMsg(S_poLog,"==========================");
    CAtEmLogging::LogMsg(S_poLog,"Initialize EtherCAT Master");
    CAtEmLogging::LogMsg(S_poLog,"==========================");
  }
  oDcmConfig.u.Dcx.bCtlOff = 0;
  oDcmConfig.u.adwReserved[0x12] = 0;
  oDcmConfig.u.adwReserved[0x13]._0_3_ = 0;
  oDcmConfig.u.adwReserved[0x16]._3_1_ = 0;
  oDcmConfig.u._92_8_ = 0;
  oDcmConfig.u._100_8_ = 0;
  oDcmConfig.u._108_8_ = 0;
  oDcmConfig._0_8_ = 0x78aec29106;
  oDcmConfig.u.Dcx.nCtlSetVal = 0x100;
  oDcmConfig.u.adwReserved[7] = dwBusCycleTimeUsec;
  oDcmConfig.u._36_8_ = 0x20;
  oDcmConfig.u.Dcx.bLogEnabled = (999 < dwBusCycleTimeUsec) + 1 + (uint)(999 < dwBusCycleTimeUsec);
  oDcmConfig.u.Dcx.nMaxValidVal = 0x20;
  oDcmConfig.u._52_8_ = 0x500000000;
  oDcmConfig.u.Dcx.wExtClockFixedAddr = 1000;
  oDcmConfig.u.Dcx.dwExtClockTimeout._0_2_ = 0;
  oDcmConfig.u.Dcx.dwExtClockTimeout._2_2_ = 0xfa;
  oDcmConfig.u.adwReserved[0x11]._2_2_ = 0;
  oDcmConfig.u.adwReserved[0x14]._3_1_ = 0x1a;
  oDcmConfig.u._84_7_ = 0x14e1;
  oDcmConfig.u._79_4_ = nVerbose;
  oDcmConfig.u._12_8_ = poLinkParms;
  oDcmConfig.u._20_8_ = poLinkParmsRed;
  oDcmConfig.u._4_8_ = poOsParms;
  EVar6 = emInitMaster(0);
  pCVar20 = S_poLog;
  if (EVar6 != eDcmMode_Off) {
    uVar15 = ecatGetText(EVar6);
    pcVar23 = "Cannot initialize EtherCAT-Master! (Result = %s 0x%x)";
    EVar3 = EVar6;
    goto LAB_001446ad;
  }
  sVar16 = strlen(licenseKey);
  pCVar14 = local_150;
  if (1 < sVar16) {
    CAtEmLogging::LogMsg(S_poLog,"LicenseKey: %s",licenseKey);
    uVar8 = emSetLicenseKey(0,licenseKey);
    pCVar20 = S_poLog;
    if (uVar8 == 0) {
      CAtEmLogging::LogMsg(S_poLog,"ACTIVATION SUCCESSFULL");
    }
    else {
      uVar15 = ecatGetText(uVar8);
      CAtEmLogging::LogError(pCVar20,"ACTIVATION FAILED (Result = %s 0x%x)",uVar15,(ulong)uVar8);
    }
  }
  S_DemoThreadParam.bJobThreadRunning = 0;
  S_DemoThreadParam.bJobThreadShutdown = 0;
  iVar5 = local_168 * 1000;
  S_DemoThreadParam.pLogInst = S_poLog;
  S_DemoThreadParam.pNotInst = pCVar14;
  S_DemoThreadParam.dwCpuIndex = dwCpuIndex;
  S_DemoThreadParam.dwBusCycleTimeUsec = dwBusCycleTimeUsec;
  local_158 = poLog;
  S_pvtJobThread =
       (EC_T_PVOID)OsCreateThread("tEcJobTask",tEcJobTask,0x62,0x4000,&S_DemoThreadParam);
  CEcTimer::Start(&oTimeout,2000);
  while( true ) {
    iVar9 = CEcTimer::IsElapsed(&oTimeout);
    if (iVar9 != 0 || S_DemoThreadParam.bJobThreadRunning != 0) break;
    LinuxSleep(10);
  }
  if (S_DemoThreadParam.bJobThreadRunning == 0) {
    EVar12 = 0x1fd1fc;
    CAtEmLogging::LogError(S_poLog,"Timeout starting JobTask");
    EVar6 = 0x98110010;
    goto LAB_001446f5;
  }
  CEcTimer::Stop(&oTimeout);
  puVar22 = local_148;
  uVar8 = emConfigureMaster(0,local_140,local_148,local_13c);
  pCVar20 = S_poLog;
  if (uVar8 != 0) {
    uVar17 = (ulong)uVar8;
    uVar15 = ecatGetText(uVar8);
    pcVar23 = "Cannot configure EtherCAT-Master! %s (Result = 0x%x)";
    goto LAB_00144a41;
  }
  if (puVar22 == (EC_T_PBYTE)0x0) goto LAB_00144cc2;
  oDcmConfig.u.BusShift.dwInSyncLimit = 0;
  oDcmConfig.u.BusShift.dwInSyncSettleTime = 0;
  oDcmConfig.u._28_8_ = 0;
  oDcmConfig.u._36_8_ = 0;
  oDcmConfig._0_8_ = 0x2ee000000000;
  oDcmConfig.u.BusShift.nCtlGain = 0xd;
  oDcmConfig.u.BusShift.nCtlDriftErrorGain = 0x5dc;
  oDcmConfig.u.BusShift.nMaxValidVal = 10000;
  if (eDcmMode == eDcmMode_MasterRefClock) {
    oDcmConfig.u.BusShift.bLogEnabled = 1;
LAB_00144ac5:
    oDcmConfig.u.BusShift.dwInSyncSettleTime = 1;
  }
  else {
    oDcmConfig.u.BusShift.bLogEnabled = 0xc;
    if (dwBusCycleTimeUsec < 1000) {
      oDcmConfig.u.BusShift.bLogEnabled = 6;
    }
    if (eDcmMode != eDcmMode_Dcx) goto LAB_00144ac5;
  }
  EVar6 = emDcConfigure(0);
  if (EVar6 != eDcmMode_Off) {
    pcVar23 = "Cannot configure DC! (Result = 0x%x)";
    goto LAB_00144cf7;
  }
  bVar1 = 2 < pCVar14->m_nVerbosePrinting;
  if (bDcmCtlOff != 0 && nVerbose != 0) {
    CAtEmLogging::LogMsg(S_poLog,"DCM control loop disabled for diagnosis!\n");
  }
  memset(&oDcmConfig,0,0x88);
  if (eDcmMode_Dcx < eDcmMode) {
switchD_00144b5e_caseD_3:
    EVar12 = 0x1fd299;
    CAtEmLogging::LogError(S_poLog,"DCM mode is not supported!");
    EVar6 = 0x98110001;
    goto LAB_001446f5;
  }
  uVar8 = (uint)bVar1;
  switch(eDcmMode) {
  case eDcmMode_BusShift:
    oDcmConfig.eMode = eDcmMode_BusShift;
    goto LAB_00144b92;
  case eDcmMode_MasterShift:
    oDcmConfig.eMode = eDcmMode_MasterShift;
LAB_00144b92:
    oDcmConfig.u.BusShift.nCtlSetVal = iVar5;
    oDcmConfig.u.BusShift.dwInSyncLimit = (dwBusCycleTimeUsec * 1000) / 5;
    oDcmConfig.u.BusShift.bCtlOff = bDcmCtlOff;
    oDcmConfig.u._16_4_ = uVar8;
    break;
  case eDcmMode_LinkLayerRefClock:
    goto switchD_00144b5e_caseD_3;
  case eDcmMode_MasterRefClock:
    oDcmConfig.u.BusShift.nCtlSetVal = iVar5;
    oDcmConfig.eMode = eDcmMode_MasterRefClock;
    oDcmConfig.u.BusShift.nCtlGain = uVar8;
    break;
  case eDcmMode_Dcx:
    oDcmConfig.u.BusShift.nCtlSetVal = iVar5;
    oDcmConfig.eMode = eDcmMode_Dcx;
    oDcmConfig.u.BusShift.dwInSyncLimit = (dwBusCycleTimeUsec * 1000) / 5;
    oDcmConfig.u.Dcx.nCtlSetVal = iVar5;
    oDcmConfig.u.BusShift.bCtlOff = bDcmCtlOff;
    oDcmConfig.u.Dcx.dwInSyncLimit = (dwBusCycleTimeUsec * 1000) / 0x32;
    oDcmConfig.u.adwReserved[0xc]._0_1_ = bVar1;
    oDcmConfig.u.Dcx.bLogEnabled._1_3_ = 0;
    oDcmConfig.u.Dcx.bCtlOff = bDcmCtlOff;
    oDcmConfig.u.Dcx.dwExtClockTimeout._0_2_ = 1000;
    oDcmConfig.u.Dcx.dwExtClockTimeout._2_2_ = 0;
    oDcmConfig.u.Dcx.wExtClockFixedAddr = 0;
    oDcmConfig.u._16_4_ = uVar8;
  }
  uVar8 = emDcmConfigure(0,&oDcmConfig,0);
  pCVar20 = S_poLog;
  puVar22 = local_148;
  if (uVar8 == 0) {
LAB_00144cc2:
    oDcmConfig.u.BusShift.nMaxValidVal = 0;
    oDcmConfig.u.BusShift.bLogEnabled = 0;
    oDcmConfig.u.BusShift.dwInSyncLimit = 0;
    oDcmConfig._0_8_ = 0;
    oDcmConfig.u.BusShift.nCtlGain = 0;
    oDcmConfig.u.BusShift.nCtlDriftErrorGain = 0;
    EVar12 = 0x145e91;
    EVar6 = emRegisterClient(0,ecatNotifyCallback,pCVar14);
    if (EVar6 != eDcmMode_Off) {
      pcVar23 = "Cannot register client! (Result = 0x%x)";
LAB_00144cf7:
      CAtEmLogging::LogError(S_poLog,pcVar23,(ulong)EVar6);
      EVar12 = (EC_T_STATE)pcVar23;
      goto LAB_001446f5;
    }
    S_dwClntId = oDcmConfig.eMode;
    pCVar14->m_dwClientID = oDcmConfig.eMode;
    if (nVerbose < 2) {
      if (nVerbose == 1) goto LAB_00144da3;
      uVar17 = extraout_RDX;
      if (nVerbose != 0) goto LAB_00144e07;
    }
    else {
      uVar8 = emScanBus(0,5000);
      pCVar20 = S_poLog;
      if (((uVar8 == 0x9811001e) || (uVar8 == 0)) || (uVar8 == 0x9811017b)) {
        PrintSlaveInfos(0,local_158);
      }
      else {
        uVar15 = ecatGetText(uVar8);
        CAtEmLogging::LogError(pCVar20,"Cannot scan bus: %s (0x%lx)",uVar15,(ulong)uVar8);
      }
LAB_00144da3:
      uVar8 = emGetSrcMacAddress(0,&oDcmConfig);
      if (uVar8 != 0) {
        CAtEmLogging::LogError(S_poLog,"Cannot get MAC address! (Result = 0x%x)",(ulong)uVar8);
      }
      uVar17 = (ulong)oDcmConfig._0_8_ >> 0x28 & 0xff;
      CAtEmLogging::LogMsg
                (S_poLog,"EtherCAT network adapter MAC: %02X-%02X-%02X-%02X-%02X-%02X\n",
                 oDcmConfig._0_8_ & 0xff,(ulong)oDcmConfig._0_8_ >> 8 & 0xff,
                 (ulong)oDcmConfig._0_8_ >> 0x10 & 0xff,(ulong)oDcmConfig._0_8_ >> 0x18 & 0xff,
                 (ulong)oDcmConfig._0_8_ >> 0x20 & 0xff);
LAB_00144e07:
      CAtEmLogging::LogMsg(S_poLog,"=====================",uVar17);
      CAtEmLogging::LogMsg(S_poLog,"Start EtherCAT Master");
      EVar12 = 0x1ff0ea;
      CAtEmLogging::LogMsg(S_poLog,"=====================");
    }
    EVar7 = ecatSetMasterState(1,EVar12);
    uVar17 = (ulong)EVar7;
    CEmNotification::ProcessNotificationJobs(pCVar14);
    pCVar20 = S_poLog;
    if (EVar7 == 0) {
      CAtEmLogging::LogMsg(S_poLog,"prepare");
      pCVar20 = local_158;
      oDcmConfig._0_8_ = oDcmConfig._0_8_ & 0xffffffffffff0000;
      EVar10 = FindSlaveGetFixedAddr(0,local_158,0,2,0x3ec3052,(EC_T_WORD *)&oDcmConfig);
      if (EVar10 == 0) {
        EVar10 = FindSlaveGetFixedAddr(0,pCVar20,0,2,0x3f43052,(EC_T_WORD *)&oDcmConfig);
        pEVar19 = extraout_RDX_01;
        if ((EVar10 != 0) ||
           (EVar10 = FindSlaveGetFixedAddr(0,local_158,0,2,0x3f63052,(EC_T_WORD *)&oDcmConfig),
           pEVar19 = extraout_RDX_02, EVar10 != 0)) {
          S_dwSlaveIdx14 = S_dwAppFoundSlaves;
        }
      }
      else {
        S_dwSlaveIdx14 = S_dwAppFoundSlaves;
        pEVar19 = extraout_RDX_00;
      }
      if (S_dwSlaveIdx14 != 0xffff) {
        S_dwAppFoundSlaves = S_dwAppFoundSlaves + 1;
        EVar7 = ecatGetCfgSlaveInfo((uint)(ushort)(undefined2)oDcmConfig.eMode,
                                    (short)S_dwSlaveIdx14 * 0xf8 + 0x4530,pEVar19);
        if (EVar7 != 0) {
          CAtEmLogging::LogError(S_poLog,"ERROR: ecatGetCfgSlaveInfo() returns with error.");
        }
      }
      pCVar20 = local_158;
      EVar10 = FindSlaveGetFixedAddr(0,local_158,0,2,0x7d83052,(EC_T_WORD *)&oDcmConfig);
      pEVar19 = extraout_RDX_03;
      if (((EVar10 != 0) ||
          (EVar10 = FindSlaveGetFixedAddr(0,pCVar20,0,2,0x7d43052,(EC_T_WORD *)&oDcmConfig),
          pEVar19 = extraout_RDX_04, EVar10 != 0)) ||
         (EVar10 = FindSlaveGetFixedAddr(0,local_158,0,2,0x7d23052,(EC_T_WORD *)&oDcmConfig),
         pEVar19 = extraout_RDX_05, EVar10 != 0)) {
        S_dwSlaveIdx24 = S_dwAppFoundSlaves;
      }
      if (S_dwSlaveIdx24 != 0xffff) {
        S_dwAppFoundSlaves = S_dwAppFoundSlaves + 1;
        EVar7 = ecatGetCfgSlaveInfo((uint)(ushort)(undefined2)oDcmConfig.eMode,
                                    (short)S_dwSlaveIdx24 * 0xf8 + 0x4530,pEVar19);
        if (EVar7 != 0) {
          CAtEmLogging::LogError(S_poLog,"ERROR: ecatGetCfgSlaveInfo() returns with error.");
        }
      }
      EVar10 = FindSlaveGetFixedAddr(0,local_158,0,2,0x10243052,(EC_T_WORD *)&oDcmConfig);
      if (EVar10 != 0) {
        S_dwSlaveIdx4132 = S_dwAppFoundSlaves;
        sVar2 = (short)S_dwAppFoundSlaves;
        S_dwAppFoundSlaves = S_dwAppFoundSlaves + 1;
        EVar7 = ecatGetCfgSlaveInfo((uint)(ushort)(undefined2)oDcmConfig.eMode,sVar2 * 0xf8 + 0x4530
                                    ,pSlaveInfo);
        if (EVar7 != 0) {
          CAtEmLogging::LogError(S_poLog,"ERROR: ecatGetCfgSlaveInfo() returns with error.");
        }
      }
      pCVar20 = local_158;
      EVar10 = FindSlaveGetFixedAddr(0,local_158,0,4,6,(EC_T_WORD *)&oDcmConfig);
      EVar12 = (EC_T_STATE)pCVar20;
      if (EVar10 != 0) {
        S_dwSlaveIdxETCio100 = S_dwAppFoundSlaves;
        EVar12 = S_dwAppFoundSlaves * 0xf8 + 0x244530;
        S_dwAppFoundSlaves = S_dwAppFoundSlaves + 1;
        EVar7 = ecatGetCfgSlaveInfo((uint)(ushort)(undefined2)oDcmConfig.eMode,(EC_T_WORD)EVar12,
                                    pSlaveInfo_00);
        if (EVar7 != 0) {
          EVar12 = 0x1fdbb5;
          CAtEmLogging::LogError(S_poLog,"ERROR: ecatGetCfgSlaveInfo() returns with error.");
        }
      }
      EVar11 = ecatSetMasterState(2,EVar12);
      uVar17 = (ulong)EVar11;
      CEmNotification::ProcessNotificationJobs(pCVar14);
      EVar7 = S_dwClntId;
      pCVar20 = S_poLog;
      if (EVar11 == 0) {
        if (puVar22 == (EC_T_PBYTE)0x0) {
          if (nVerbose != 0) {
            CAtEmLogging::LogMsg
                      (S_poLog,"No ENI file provided. EC-Master started with generated ENI file.");
          }
        }
        else {
          uVar17 = (ulong)S_dwSlaveIdx4132;
          if (uVar17 != 0xffff) {
            oDcmConfig._0_8_ = oDcmConfig._0_8_ & 0xffffffff00000000;
            _wOffsetTmp = _wOffsetTmp & 0xffff0000;
            nDiffAvg = 0;
            pEVar19 = S_aSlaveList + uVar17;
            EVar11 = ecatCoeSdoUpload(S_aSlaveList[uVar17].dwSlaveId,0x40a2,'\0',&byNumElements,1,
                                      &dwSize,in_stack_fffffffffffffe88,nVerbose);
            pCVar20 = S_poLog;
            local_168 = EVar7;
            if (EVar11 == 0) {
              if (1 < nVerbose) {
                CAtEmLogging::LogMsg
                          (S_poLog,"tEl4132Mbx: EL4132 user scale: num elements = %d",
                           (ulong)byNumElements);
              }
            }
            else {
              uVar15 = ecatGetText(EVar11);
              CAtEmLogging::LogError
                        (pCVar20,"tEl4132Mbx: error in COE SDO Upload! %s (0x%x)",uVar15,
                         (ulong)EVar11);
            }
            EVar7 = ecatCoeSdoUpload(pEVar19->dwSlaveId,0x40a2,'\x01',(EC_T_BYTE *)&wOffsetTmp,2,
                                     &dwSize,in_stack_fffffffffffffe88,nVerbose);
            pCVar20 = S_poLog;
            uVar8 = _wOffsetTmp & 0xffff;
            if (EVar7 == 0) {
              if (1 < nVerbose) {
                CAtEmLogging::LogMsg(S_poLog,"tEl4132Mbx: EL4132 offset = 0x%x",(ulong)wOffsetTmp);
              }
            }
            else {
              uVar15 = ecatGetText(EVar7);
              CAtEmLogging::LogError
                        (pCVar20,"tEl4132Mbx: error in COE SDO Upload! %s (0x%x)",uVar15,
                         (ulong)EVar7);
            }
            pEVar24 = &dwSize;
            EVar11 = 4;
            EVar7 = ecatCoeSdoUpload(pEVar19->dwSlaveId,0x40a2,'\x02',(EC_T_BYTE *)&nDiffAvg,4,
                                     pEVar24,in_stack_fffffffffffffe88,nVerbose);
            EVar4 = nDiffAvg;
            pCVar20 = S_poLog;
            dwTimeout = (EC_T_DWORD)pEVar24;
            if (EVar7 == 0) {
              if (1 < nVerbose) {
                CAtEmLogging::LogMsg(S_poLog,"tEl4132Mbx: EL4132 gain = 0x%x",(ulong)(uint)nDiffAvg)
                ;
              }
            }
            else {
              uVar15 = ecatGetText(EVar7);
              CAtEmLogging::LogError
                        (pCVar20,"tEl4132Mbx: error in COE SDO Upload! %s (0x%x)",uVar15,
                         (ulong)EVar7);
            }
            uVar8 = uVar8 + 1;
            if (0x1000 < (ushort)uVar8) {
              uVar8 = 0;
            }
            _wOffsetTmp = CONCAT22(uStack_162,(short)uVar8);
            EVar7 = ecatCoeSdoDownload(pEVar19->dwSlaveId,1,(EC_T_BYTE)&wOffsetTmp,(EC_T_BYTE *)0x2,
                                       EVar11,dwTimeout,in_stack_fffffffffffffe88);
            pCVar20 = S_poLog;
            if (EVar7 != 0) {
              uVar15 = ecatGetText(EVar7);
              CAtEmLogging::LogError
                        (pCVar20,"tEl4132Mbx: error in COE SDO Download! %s (0x%x)",uVar15,
                         (ulong)EVar7);
            }
            nDiffAvg = EVar4 + 0x1000U;
            if (0x10000000 < EVar4 + 0x1000U) {
              nDiffAvg = 0;
            }
            EVar7 = ecatCoeSdoDownload(pEVar19->dwSlaveId,2,(EC_T_BYTE)&nDiffAvg,(EC_T_BYTE *)0x4,
                                       EVar11,dwTimeout,in_stack_fffffffffffffe88);
            pCVar14 = local_150;
            pCVar20 = S_poLog;
            if (EVar7 != 0) {
              uVar15 = ecatGetText(EVar7);
              CAtEmLogging::LogError
                        (pCVar20,"tEl4132Mbx: error in COE SDO Download! %s (0x%x)",uVar15,
                         (ulong)EVar7);
            }
            pCVar20 = local_158;
            CoeReadObjectDictionary
                      (0,local_158,nVerbose,(EC_T_BOOL *)&oDcmConfig,local_168,pEVar19->dwSlaveId,1,
                       5000);
            EVar12 = (EC_T_STATE)pCVar20;
            puVar22 = local_148;
          }
          EVar6 = ecatSetMasterState(4,EVar12);
          CEmNotification::ProcessNotificationJobs(pCVar14);
          pCVar20 = S_poLog;
          if (EVar6 != eDcmMode_Off) {
            uVar15 = ecatGetText(EVar6);
            EVar12 = 0x1fd572;
            CAtEmLogging::LogError
                      (pCVar20,"Cannot start set master state to SAFEOP (Result = %s (0x%lx))",
                       uVar15,(ulong)EVar6);
            if (eDcmMode != eDcmMode_Off) {
              oDcmConfig._0_8_ = oDcmConfig._0_8_ & 0xffffffff00000000;
              pEVar24 = &dwSize;
              dwSize = 0;
              nDiffAvg = 0;
              _wOffsetTmp = 0;
              EVar6 = ecatDcmGetStatus(&oDcmConfig.eMode,(EC_T_INT *)pEVar24,&nDiffAvg,
                                       (EC_T_INT *)&wOffsetTmp);
              pCVar20 = S_poLog;
              EVar12 = (EC_T_STATE)pEVar24;
              if (EVar6 == eDcmMode_Off) {
                pCVar14 = local_150;
                if (oDcmConfig.eMode == eDcmMode_Off) goto LAB_001446f5;
                uVar15 = ecatGetText(oDcmConfig.eMode);
                pcVar23 = "DCM Status: %s (0x%08X)\n";
                EVar3 = oDcmConfig.eMode;
              }
              else {
                uVar15 = ecatGetText(EVar6);
                pcVar23 = "Cannot get DCM status! %s (0x%08X)\n";
                EVar3 = EVar6;
              }
LAB_001446ad:
              CAtEmLogging::LogError(pCVar20,pcVar23,uVar15,(ulong)EVar3);
              EVar12 = (EC_T_STATE)pcVar23;
              pCVar14 = local_150;
            }
            goto LAB_001446f5;
          }
          EVar7 = ecatSetMasterState(8,EVar12);
          uVar17 = (ulong)EVar7;
          CEmNotification::ProcessNotificationJobs(pCVar14);
          pCVar20 = S_poLog;
          if (EVar7 != 0) {
            uVar15 = ecatGetText(EVar7);
            pcVar23 = "Cannot start set master state to OP (Result = %s (0x%lx))";
            goto LAB_00144a41;
          }
        }
        EVar7 = nVerbose;
        if (S_bEnaPerfJobs != 0) {
          CAtEmLogging::LogMsg(S_poLog,"");
          pCVar20 = S_poLog;
          EVar12 = ecatGetMasterState();
          pEVar18 = ecatStateToStr(EVar12);
          CAtEmLogging::LogMsg(pCVar20,"Job times during startup <INIT> to <%s>:",pEVar18);
          ecatPerfMeasShow(&S_TscMeasDesc,0xffffffff,S_aszMeasInfo);
          CAtEmLogging::LogMsg(S_poLog,"");
          puVar22 = local_148;
          ecatPerfMeasReset(&S_TscMeasDesc,0xffffffff);
          EVar7 = nVerbose;
        }
        pcVar23 = (char *)(ulong)dwDuration;
        nVerbose = EVar7;
        if (dwDuration != 0) {
          CEcTimer::Start(&oTimeout,dwDuration);
        }
        local_148 = (EC_T_PBYTE)CONCAT71(local_148._1_7_,(int)EVar7 < 3);
        local_168 = 1;
        while (EVar12 = (EC_T_STATE)pcVar23, bRun != 0) {
          if ((local_98 & 1) != 0) {
            iVar5 = CEcTimer::IsElapsed(&oTimeout);
            EVar12 = (EC_T_STATE)pcVar23;
            if (iVar5 != 0) break;
          }
          if (1 < nVerbose) {
            pcVar23 = (char *)0xffffffffffffffff;
            ecatPerfMeasShow(&S_TscMeasDesc,0xffffffffffffffff,S_aszMeasInfo);
          }
          bRun = 1;
          if ((ulong)S_dwSlaveIdx4132 != 0xffff) {
            oDcmConfig._0_8_ = oDcmConfig._0_8_ & 0xffffffff00000000;
            dwSize = 0;
            pcVar23 = (char *)0x1018;
            EVar7 = ecatCoeSdoUpload(S_aSlaveList[S_dwSlaveIdx4132].dwSlaveId,0x1018,'\x01',
                                     (EC_T_BYTE *)&dwSize,4,&oDcmConfig.eMode,
                                     in_stack_fffffffffffffe88,nVerbose);
            pCVar20 = S_poLog;
            if (EVar7 != 0) {
              uVar15 = ecatGetText(EVar7);
              pcVar23 = "myAppDiagnosis: error in COE SDO Upload of object 0x1018! %s (0x%x)";
              CAtEmLogging::LogError
                        (pCVar20,
                         "myAppDiagnosis: error in COE SDO Upload of object 0x1018! %s (0x%x)",
                         uVar15,(ulong)EVar7);
            }
          }
          if (eDcmMode != eDcmMode_Off && puVar22 != (EC_T_PBYTE)0x0) {
            dwSize = 0;
            nDiffAvg = 0;
            _wOffsetTmp = 0;
            _byNumElements = 0;
            if (((local_38 & 1) == 0) || (iVar5 = CEcTimer::IsElapsed(&oDcmStatusTimer), iVar5 != 0)
               ) {
              CEcTimer::Start(&oDcmStatusTimer,5000);
              cVar21 = (char)local_148;
            }
            else {
              cVar21 = '\x01';
            }
            pcVar23 = (char *)&nDiffAvg;
            EVar7 = ecatDcmGetStatus(&dwSize,(EC_T_INT *)pcVar23,(EC_T_INT *)&wOffsetTmp,
                                     (EC_T_INT *)&byNumElements);
            pCVar20 = S_poLog;
            if (EVar7 == 0) {
              if (local_168 != 0) {
                EVar12 = ecatGetMasterState();
                pEVar18 = ecatStateToStr(EVar12);
                pcVar23 = "DCM during startup (<INIT> to <%s>)";
                CAtEmLogging::LogMsg(pCVar20,"DCM during startup (<INIT> to <%s>)",pEVar18);
              }
              pCVar20 = S_poLog;
              if ((1 < dwSize + 0x67eefff9) && (dwSize != 0)) {
                uVar15 = ecatGetText(dwSize);
                pcVar23 = "DCM Status: %s (0x%08X)\n";
                CAtEmLogging::LogMsg(pCVar20,"DCM Status: %s (0x%08X)\n",uVar15,(ulong)dwSize);
              }
              uVar8 = local_168;
              if (cVar21 == '\0') {
                pcVar23 = "DCM Diff(ns): Cur=%7d, Avg=%7d, Max=%7d";
                CAtEmLogging::LogMsg
                          (S_poLog,"DCM Diff(ns): Cur=%7d, Avg=%7d, Max=%7d",(ulong)(uint)nDiffAvg,
                           (ulong)_wOffsetTmp,(ulong)_byNumElements);
                uVar8 = local_168;
              }
            }
            else {
              EVar12 = ecatGetMasterState();
              if (EVar12 != eEcatState_OP) {
                EVar12 = ecatGetMasterState();
                uVar8 = 0;
                if (EVar12 != eEcatState_SAFEOP) goto LAB_00145749;
              }
              pCVar20 = S_poLog;
              uVar15 = ecatGetText(EVar7);
              pcVar23 = "Cannot get DCM status! %s (0x%08X)\n";
              CAtEmLogging::LogError
                        (pCVar20,"Cannot get DCM status! %s (0x%08X)\n",uVar15,(ulong)EVar7);
              uVar8 = 0;
            }
LAB_00145749:
            if (eDcmMode == eDcmMode_Dcx) {
              oDcmConfig._0_8_ = 0;
              pcVar23 = (char *)&dwSize;
              uVar13 = emDcxGetStatus(0,pcVar23,&nDiffAvg,&wOffsetTmp,&byNumElements,&oDcmConfig);
              pCVar20 = S_poLog;
              if (uVar13 == 0) {
                if (local_168 != 0) {
                  EVar12 = ecatGetMasterState();
                  pEVar18 = ecatStateToStr(EVar12);
                  pcVar23 = "DCX during startup (<INIT> to <%s>)";
                  CAtEmLogging::LogMsg(pCVar20,"DCX during startup (<INIT> to <%s>)",pEVar18);
                }
                pCVar20 = S_poLog;
                if ((1 < dwSize + 0x67eefff9) && (dwSize != 0)) {
                  uVar15 = ecatGetText(dwSize);
                  pcVar23 = "DCX Status: %s (0x%08X)\n";
                  CAtEmLogging::LogMsg(pCVar20,"DCX Status: %s (0x%08X)\n",uVar15,(ulong)dwSize);
                }
                if (cVar21 == '\0') {
                  pcVar23 = "DCX Diff(ns): Cur=%7d, Avg=%7d, Max=%7d, TimeStamp=%7d";
                  CAtEmLogging::LogMsg
                            (S_poLog,"DCX Diff(ns): Cur=%7d, Avg=%7d, Max=%7d, TimeStamp=%7d",
                             (ulong)(uint)nDiffAvg,(ulong)_wOffsetTmp,(ulong)_byNumElements,
                             oDcmConfig._0_8_);
                }
              }
              else {
                EVar12 = ecatGetMasterState();
                if (EVar12 != eEcatState_OP) {
                  EVar12 = ecatGetMasterState();
                  uVar8 = 0;
                  if (EVar12 != eEcatState_SAFEOP) goto LAB_00145863;
                }
                pCVar20 = S_poLog;
                uVar15 = ecatGetText(uVar13);
                uVar8 = 0;
                pcVar23 = "Cannot get DCX status! %s (0x%08X)\n";
                CAtEmLogging::LogError
                          (pCVar20,"Cannot get DCX status! %s (0x%08X)\n",uVar15,(ulong)uVar13);
              }
            }
LAB_00145863:
            if (uVar8 != 0) {
              local_168 = 0;
              emDcmResetStatus(0);
            }
          }
          CEmNotification::ProcessNotificationJobs(local_150);
          LinuxSleep(5);
        }
        if (S_bEnaPerfJobs == 0) {
          EVar6 = eDcmMode_Off;
          pCVar14 = local_150;
        }
        else {
          EVar6 = eDcmMode_Off;
          CAtEmLogging::LogMsg(S_poLog,"");
          CAtEmLogging::LogMsg(S_poLog,"Job times before shutdown");
          EVar12 = eEcatState_BCppDummy;
          ecatPerfMeasShow(&S_TscMeasDesc,0xffffffffffffffff,S_aszMeasInfo);
          pCVar14 = local_150;
        }
        goto LAB_001446f5;
      }
      uVar15 = ecatGetText(EVar11);
      pcVar23 = "Cannot start set master state to PREOP (Result = %s (0x%lx))";
    }
    else {
      uVar15 = ecatGetText(EVar7);
      pcVar23 = "Cannot start set master state to INIT (Result = %s (0x%lx))";
    }
  }
  else {
    uVar17 = (ulong)uVar8;
    if (uVar8 == 0x9811001c) {
      CAtEmLogging::LogError(S_poLog,"Cannot configure DCM mode!");
      CAtEmLogging::LogError
                (S_poLog,
                 "Start with -dcmmode off to run the DC demo without DCM, or prepare the ENI file to support the requested DCM mode"
                );
      CAtEmLogging::LogError
                (S_poLog,
                 "In ET9000 for example, select under Advanced settings\\Distributed clocks DC in use and Slave Mode"
                );
      CAtEmLogging::LogError(S_poLog,"to support BusShift and MasterRefClock modes.");
      EVar12 = 0x1fd3d1;
      CAtEmLogging::LogError(S_poLog,"Please refer to the class A manual for further information");
      EVar6 = 0x9811001c;
      goto LAB_001446f5;
    }
    uVar15 = ecatGetText(uVar8);
    pcVar23 = "Cannot configure DCM mode! %s (Result = 0x%x)";
  }
LAB_00144a41:
  EVar6 = (EC_T_DCM_MODE)uVar17;
  CAtEmLogging::LogError(pCVar20,pcVar23,uVar15,uVar17);
  EVar12 = (EC_T_STATE)pcVar23;
LAB_001446f5:
  if (nVerbose != 0) {
    CAtEmLogging::LogMsg(S_poLog,"========================");
    CAtEmLogging::LogMsg(S_poLog,"Shutdown EtherCAT Master");
    EVar12 = 0x1ff0e7;
    CAtEmLogging::LogMsg(S_poLog,"========================");
  }
  EVar7 = ecatSetMasterState(1,EVar12);
  pCVar20 = S_poLog;
  if (EVar7 != 0) {
    uVar15 = ecatGetText(EVar7);
    CAtEmLogging::LogError(pCVar20,"Cannot stop EtherCAT-Master! %s (0x%lx)",uVar15,(ulong)EVar7);
  }
  if (S_dwClntId != 0) {
    EVar7 = emUnregisterClient(0);
    pCVar20 = S_poLog;
    if (EVar7 != 0) {
      uVar15 = ecatGetText(EVar7);
      CAtEmLogging::LogError(pCVar20,"Cannot unregister client! %s (0x%lx)",uVar15,(ulong)EVar7);
    }
    S_dwClntId = 0;
  }
  S_DemoThreadParam.bJobThreadShutdown = 1;
  CEcTimer::Start(&oTimeout,2000);
  while (S_DemoThreadParam.bJobThreadRunning != 0) {
    iVar5 = CEcTimer::IsElapsed(&oTimeout);
    if (iVar5 != 0) break;
    LinuxSleep(10);
  }
  if (S_pvtJobThread != (EC_T_PVOID)0x0) {
    OsDeleteThreadHandle();
    S_pvtJobThread = (EC_T_PVOID)0x0;
  }
  if (S_bRasSrvStarted == '\x01') {
    CAtEmLogging::LogMsg(S_poLog,"Stop Remote Api Server\n");
    iVar5 = emRasSrvStop(S_pvRemoteApiSrvH,2000);
    if (iVar5 != 0) {
      CAtEmLogging::LogError(S_poLog,"Remote API Server shutdown failed\n");
    }
  }
  CAtEmLogging::LogMsg(S_poLog,"ecatDeinitMaster() should be called here.");
  CAtEmLogging::LogMsg
            (S_poLog,"But this would provoke a \' double free or corruption (out):\' error.");
  pCVar20 = S_poLog;
  if (EVar7 != 0) {
    uVar15 = ecatGetText(EVar7);
    CAtEmLogging::LogError
              (pCVar20,"Cannot de-initialize EtherCAT-Master! %s (0x%lx)",uVar15,(ulong)EVar7);
  }
  if (S_bEnaPerfJobs != 0) {
    ecatPerfMeasDeinit(&S_TscMeasDesc);
  }
  if (pCVar14 != (CEmNotification *)0x0) {
    operator_delete(pCVar14);
  }
  return EVar6;
}

Assistant:

EC_T_DWORD EtherCATStack(
    CAtEmLogging*       poLog
   ,EC_T_CNF_TYPE       eCnfType                /* [in] Enum type of configuration data provided */
   ,EC_T_PBYTE          pbyCnfData              /* [in] Configuration data */                      
   ,EC_T_DWORD          dwCnfDataLen            /* [in] Length of configuration data in byte */    
   ,EC_T_DWORD          dwBusCycleTimeUsec      /* [in]  bus cycle time in usec */
   ,EC_T_INT            nVerbose                /* [in]  verbosity level */
   ,EC_T_DWORD          dwDuration              /* [in]  test duration in msec (0 = forever) */
   ,EC_T_LINK_PARMS*    poLinkParms             /* [in]  pointer to link parameter */
   ,EC_T_VOID*          pvTimingEvent           /* [in]  Timing event handle */
   ,EC_T_DWORD          dwCpuIndex              /* [in]  SMP only: CPU index */
   ,EC_T_BOOL           bEnaPerfJobs            /* [in]  Performance measurement */
#ifdef ATEMRAS_SERVER 
   ,EC_T_WORD           wServerPort             /* [in]   Remote API Server Port */
#endif
   ,EC_T_LINK_PARMS*    poLinkParmsRed          /* [in]  Redundancy Link Layer Parameter */
   ,EC_T_OS_PARMS*      poOsParms               /* [in]  pointer to OS parameters  */
   ,EC_T_DCM_MODE       eDcmMode                /* [in]  DCM mode */
   ,EC_T_BOOL           bDcmCtlOff              /* [in]  Disables / Enables the control loop for diagnosis */
   ,void (*callbackFctPtr)(EC_T_BYTE*, EC_T_BYTE*)
   ,char*				licenseKey
)
{
	
	callbackFct = callbackFctPtr;
    EC_T_DWORD       dwRetVal = EC_E_NOERROR;
    EC_T_DWORD       dwRes    = EC_E_NOERROR;
    EC_T_BOOL        bRes     = EC_FALSE;
    CEcTimer         oTimeout;
    CEmNotification* pNotification = EC_NULL;
    CEcTimer         oDcmStatusTimer;
    EC_T_BOOL        bFirstDcmStatus = EC_TRUE;
    EC_T_INT         nDcmCtlSetVal = ((dwBusCycleTimeUsec*2)/3)*1000; /* set value in nanosec, 66% of the bus cycle */

    /* store parameters */
    S_poLog = poLog;
    S_bEnaPerfJobs = bEnaPerfJobs;
    S_DemoThreadParam.pvTimingEvent = pvTimingEvent;

	LogMsg("nVerbose: %d\n", nVerbose);
    /* check if interrupt mode is selected */
    if (poLinkParms->eLinkMode != EcLinkMode_POLLING)
    {
        dwRetVal = EC_E_INVALIDPARM;
        LogError("Error: Link layer in 'interrupt' mode is not supported by EcMasterDemoDc. Please select 'polling' mode.");
        goto Exit;
    }
    /* set thread affinity */
    {
        EC_T_CPUSET CpuSet;

        EC_CPUSET_ZERO(CpuSet);
        EC_CPUSET_SET(CpuSet, dwCpuIndex);
        bRes = OsSetThreadAffinity(EC_NULL, CpuSet);
        if (!bRes)
        {
            dwRetVal = EC_E_INVALIDPARM;
            LogError("Error: Set thread affinitiy, invalid CPU index %d\n", dwCpuIndex);
            goto Exit;
        }
    }
    /* create notification context */
    pNotification = EC_NEW(CEmNotification(INSTANCE_MASTER_DEFAULT, poLog));
    if (EC_NULL == pNotification)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }
    pNotification->Verbose(nVerbose);

    if (S_bEnaPerfJobs)
    {
        PERF_MEASURE_JOBS_INIT(EC_NULL);
    }
    
    /* Demo code: Remove/change this in your application: Initialize application */
    /*****************************************************************************/
    dwRes = myAppInit(poLog, nVerbose);
    if (EC_E_NOERROR != dwRes)
    {
        LogError( (EC_T_CHAR*)"myAppInit failed, error code: 0x%x", dwRes );
        dwRetVal = dwRes;
        goto Exit;
    }
#ifdef ATEMRAS_SERVER
    /*******************************/
    /* Start RAS server if enabled */
    /*******************************/
    if (0xFFFF != wServerPort)
    {
        ATEMRAS_T_SRVPARMS oRemoteApiConfig;

        OsMemset(&oRemoteApiConfig, 0, sizeof(ATEMRAS_T_SRVPARMS));
        oRemoteApiConfig.oAddr.dwAddr       = 0;                    /* INADDR_ANY */
        oRemoteApiConfig.wPort              = wServerPort;
        oRemoteApiConfig.dwCycleTime        = REMOTE_CYCLE_TIME;    /* 2 msec */
        oRemoteApiConfig.dwWDTOLimit        = (REMOTE_WD_TO_LIMIT/REMOTE_CYCLE_TIME); /* WD Timeout after 10secs */
        oRemoteApiConfig.dwReConTOLimit     = 6000;                 /* Reconnect Timeout after 6000*2msec + 10secs */
        oRemoteApiConfig.dwMasterPrio       = MAIN_THREAD_PRIO;
        oRemoteApiConfig.dwClientPrio       = MAIN_THREAD_PRIO;
        oRemoteApiConfig.pvNotifCtxt        = pNotification;        /* Notification context */
        oRemoteApiConfig.pfNotification     = RasNotifyWrapper;     /* Notification function for emras Layer */
        oRemoteApiConfig.dwConcNotifyAmount = 100;                  /* for the first pre-allocate 100 Notification spaces */
        oRemoteApiConfig.dwMbxNotifyAmount  = 50;                   /* for the first pre-allocate 50 Notification spaces */
        oRemoteApiConfig.dwMbxUsrNotifySize = 3000;                 /* 3K user space for Mailbox Notifications */
        oRemoteApiConfig.dwCycErrInterval   = 500;                  /* span between to consecutive cyclic notifications of same type */
        if (0 != nVerbose) LogMsg("Start Remote API Server now\n");
        dwRes = emRasSrvStart(oRemoteApiConfig, &S_pvRemoteApiSrvH);
        if (EC_E_NOERROR != dwRes)
        {
            LogError("ERROR: Cannot spawn Remote API Server\n");
        }
        S_bRasSrvStarted = EC_TRUE;
    }
#endif
    /******************************/
    /* Initialize EtherCAT master */
    /******************************/
    if (0 != nVerbose) LogMsg( "==========================" );
    if (0 != nVerbose) LogMsg( "Initialize EtherCAT Master" );
    if (0 != nVerbose) LogMsg( "==========================" );
    {
        EC_T_INIT_MASTER_PARMS oInitParms;

        OsMemset(&oInitParms, 0, sizeof(EC_T_INIT_MASTER_PARMS));
        oInitParms.dwSignature                   = ATECAT_SIGNATURE;
        oInitParms.dwSize                        = sizeof(EC_T_INIT_MASTER_PARMS);
        oInitParms.pLinkParms                    = poLinkParms;
        oInitParms.pLinkParmsRed                 = poLinkParmsRed;
        oInitParms.dwBusCycleTimeUsec            = dwBusCycleTimeUsec;
        oInitParms.dwMaxBusSlaves                = MASTER_CFG_ECAT_MAX_BUS_SLAVES;
        oInitParms.dwMaxQueuedEthFrames          = MASTER_CFG_MAX_QUEUED_ETH_FRAMES;
        oInitParms.dwMaxSlaveCmdPerFrame         = MASTER_CFG_MAX_SLAVECMD_PER_FRAME;
        if (dwBusCycleTimeUsec < 1000)
        {
            oInitParms.dwMaxSentQueuedFramesPerCycle = 1;
        }
        else
        {
            oInitParms.dwMaxSentQueuedFramesPerCycle = MASTER_CFG_MAX_SENT_QUFRM_PER_CYC;
        }
        oInitParms.dwEcatCmdMaxRetries           = MASTER_CFG_ECAT_CMD_MAX_RETRIES;
        oInitParms.dwEoETimeout                  = MASTER_CFG_EOE_TIMEOUT;
        oInitParms.dwFoEBusyTimeout              = MASTER_CFG_FOE_BUSY_TIMEOUT;
        oInitParms.dwLogLevel                    = nVerbose;
        oInitParms.pfLogMsgCallBack              = CAtEmLogging::OsDbgMsgHookWrapper;
        oInitParms.pOsParms                      = poOsParms;
        dwRes = ecatInitMaster(&oInitParms);        
        if (EC_E_NOERROR != dwRes)
        {
            dwRetVal = dwRes;
            LogError("Cannot initialize EtherCAT-Master! (Result = %s 0x%x)", ecatGetText(dwRes), dwRes);
            goto Exit;
        }
        
        if (strlen(licenseKey) > 1) {
			LogMsg("LicenseKey: %s",licenseKey);
			dwRes = ecatSetLicenseKey(licenseKey);
			if (EC_E_NOERROR == dwRes) LogMsg("ACTIVATION SUCCESSFULL");
			else 	 					LogError("ACTIVATION FAILED (Result = %s 0x%x)", ecatGetText(dwRes), dwRes);
		}
    }
    
    /* Create cyclic task to trigger master jobs */
    /*********************************************/
    S_DemoThreadParam.bJobThreadRunning  = EC_FALSE;
    S_DemoThreadParam.bJobThreadShutdown = EC_FALSE;
    S_DemoThreadParam.pLogInst           = S_poLog;
    S_DemoThreadParam.pNotInst           = pNotification;
    S_DemoThreadParam.dwCpuIndex         = dwCpuIndex;
    S_DemoThreadParam.dwBusCycleTimeUsec = dwBusCycleTimeUsec;
    S_pvtJobThread = OsCreateThread((EC_T_CHAR*)"tEcJobTask", tEcJobTask,
#if !(defined EC_VERSION_GO32)
                                    JOBS_THREAD_PRIO,
#else
                                    dwBusCycleTimeUsec,
#endif
                                    JOBS_THREAD_STACKSIZE, (EC_T_VOID*)&S_DemoThreadParam);
#ifdef RTAI
    OsMakeThreadPeriodic(S_pvtJobThread, dwBusCycleTimeUsec);
#endif
    /* wait until thread is running */
    oTimeout.Start(2000);
    while (!oTimeout.IsElapsed() && !S_DemoThreadParam.bJobThreadRunning)
    {
        OsSleep(10);
    }
    if (!S_DemoThreadParam.bJobThreadRunning)
    {
        dwRetVal = EC_E_TIMEOUT;
        LogError("Timeout starting JobTask");
        goto Exit;
    }
    oTimeout.Stop();

    /* Configure master */
    dwRes = ecatConfigureMaster(eCnfType, pbyCnfData, dwCnfDataLen);
    if (EC_E_NOERROR != dwRes)
    {
        dwRetVal = dwRes;
        LogError("Cannot configure EtherCAT-Master! %s (Result = 0x%x)", ecatGetText(dwRes), dwRes);
        goto Exit;
    }
    /* configure DC/DCM if master is started with ENI */
    if (pbyCnfData != EC_NULL)
    {
        /* configure DC */
        {
            EC_T_DC_CONFIGURE oDcConfigure;

            OsMemset(&oDcConfigure, 0, sizeof(EC_T_DC_CONFIGURE));
            oDcConfigure.dwTimeout          = ETHERCAT_DC_TIMEOUT;
            oDcConfigure.dwDevLimit         = ETHERCAT_DC_DEV_LIMIT;
            oDcConfigure.dwSettleTime       = ETHERCAT_DC_SETTLE_TIME;
            if (eDcmMode_MasterRefClock == eDcmMode)
            {
                oDcConfigure.dwTotalBurstLength = 10000; 
                oDcConfigure.dwBurstBulk        = 1;
            }
            else
            {
                oDcConfigure.dwTotalBurstLength = ETHERCAT_DC_ARMW_BURSTCYCLES; 
                if (dwBusCycleTimeUsec < 1000)
                {
                    /* if the cycle time is below 1000 usec, we have to reduce the number of frames sent within one cycle */
                    oDcConfigure.dwBurstBulk = ETHERCAT_DC_ARMW_BURSTSPP / 2;
                }
                else
                {
                    oDcConfigure.dwBurstBulk = ETHERCAT_DC_ARMW_BURSTSPP;
                }
            }
            if (eDcmMode_Dcx == eDcmMode)
            {
                oDcConfigure.bAcycDistributionDisabled = EC_FALSE; /* Enable acyclic distribution if cycle time is above 1000 usec to get DCX in sync */
            }
            else
            {
                oDcConfigure.bAcycDistributionDisabled = EC_TRUE;
            }
            dwRes = ecatDcConfigure(&oDcConfigure);
            if (dwRes != EC_E_NOERROR )
            {
                dwRetVal = dwRes;
                LogError("Cannot configure DC! (Result = 0x%x)", dwRes);
                goto Exit;
            }
        }
        /* configure DCM */
        {
            EC_T_DCM_CONFIG oDcmConfig;
            EC_T_BOOL       bLogEnabled = EC_FALSE;
#ifdef DCM_ENABLE_LOGFILE
            if (pNotification->Verbose() >= 3)
            {
                bLogEnabled = EC_TRUE;
            }
#endif
            if (bDcmCtlOff)
            {
                if (0 != nVerbose) LogMsg("DCM control loop disabled for diagnosis!\n");
            }
            OsMemset(&oDcmConfig, 0, sizeof(EC_T_DCM_CONFIG));
            switch (eDcmMode)
            {
            case eDcmMode_Off:
                oDcmConfig.eMode = eDcmMode_Off;
                break;
            case eDcmMode_BusShift:
                oDcmConfig.eMode = eDcmMode_BusShift;
                oDcmConfig.u.BusShift.nCtlSetVal    = nDcmCtlSetVal;
                oDcmConfig.u.BusShift.dwInSyncLimit = (dwBusCycleTimeUsec*1000)/5;    /* 20 % limit in nsec for InSync monitoring */
                oDcmConfig.u.BusShift.bLogEnabled = bLogEnabled;
                oDcmConfig.u.BusShift.bCtlOff = bDcmCtlOff;
                break;
             case eDcmMode_MasterShift:
                oDcmConfig.eMode = eDcmMode_MasterShift;
                oDcmConfig.u.MasterShift.nCtlSetVal    = nDcmCtlSetVal;
                oDcmConfig.u.MasterShift.dwInSyncLimit = (dwBusCycleTimeUsec*1000)/5;    /* 20 % limit in nsec for InSync monitoring */
                oDcmConfig.u.MasterShift.bLogEnabled = bLogEnabled;
                oDcmConfig.u.MasterShift.bCtlOff = bDcmCtlOff;
                break;
            case eDcmMode_MasterRefClock:
                oDcmConfig.eMode = eDcmMode_MasterRefClock;
                oDcmConfig.u.MasterRefClock.nCtlSetVal  = nDcmCtlSetVal;
                oDcmConfig.u.MasterRefClock.bLogEnabled = bLogEnabled;
                break;
            case eDcmMode_Dcx:
                oDcmConfig.eMode = eDcmMode_Dcx;
                /* Mastershift */
                oDcmConfig.u.Dcx.MasterShift.nCtlSetVal = nDcmCtlSetVal;
                oDcmConfig.u.Dcx.MasterShift.dwInSyncLimit = (dwBusCycleTimeUsec * 1000) / 5;    /* 20 % limit in nsec for InSync monitoring */
                oDcmConfig.u.Dcx.MasterShift.bLogEnabled = bLogEnabled;
                oDcmConfig.u.Dcx.MasterShift.bCtlOff = bDcmCtlOff;
                /* Dcx Busshift */
                oDcmConfig.u.Dcx.nCtlSetVal = nDcmCtlSetVal;
                oDcmConfig.u.Dcx.dwInSyncLimit = (dwBusCycleTimeUsec * 1000) / 50;   /* 2 % limit in nsec for InSync monitoring */
                oDcmConfig.u.Dcx.bLogEnabled = bLogEnabled;
                oDcmConfig.u.Dcx.bCtlOff = bDcmCtlOff;
                oDcmConfig.u.Dcx.dwExtClockTimeout = 1000;
                oDcmConfig.u.Dcx.wExtClockFixedAddr = 0; /* 0 only when clock adjustment in external mode configured by EcEngineer */
                break;
            default:
                dwRetVal = EC_E_NOTSUPPORTED;
                LogError("DCM mode is not supported!");
                goto Exit;

            }
            dwRes = ecatDcmConfigure(&oDcmConfig, 0);
            switch (dwRes)
            {
            case EC_E_NOERROR:
                break;
            case EC_E_FEATURE_DISABLED:
                LogError("Cannot configure DCM mode!");
                LogError("Start with -dcmmode off to run the DC demo without DCM, or prepare the ENI file to support the requested DCM mode");
                LogError("In ET9000 for example, select under ""Advanced settings\\Distributed clocks"" ""DC in use"" and ""Slave Mode""");
                LogError("to support BusShift and MasterRefClock modes.");
                LogError("Please refer to the class A manual for further information");
                dwRetVal = dwRes;
                goto Exit;
            default:
                LogError("Cannot configure DCM mode! %s (Result = 0x%x)", ecatGetText(dwRes), dwRes);
                dwRetVal = dwRes;
                goto Exit;
            }
        }
    }
    /* Register client */
    {
        EC_T_REGISTERRESULTS oRegisterResults;

        OsMemset(&oRegisterResults, 0, sizeof(EC_T_REGISTERRESULTS));
        dwRes = ecatRegisterClient(ecatNotifyCallback, pNotification, &oRegisterResults);
        if (EC_E_NOERROR != dwRes)
        {
            dwRetVal = dwRes;
            LogError("Cannot register client! (Result = 0x%x)", dwRes);
            goto Exit;
        }
        S_dwClntId = oRegisterResults.dwClntId;
        pNotification->SetClientID(S_dwClntId);
    }
    
    /* Print found slaves */
    if (nVerbose >= 2)
    {
        dwRes = ecatScanBus(ETHERCAT_SCANBUS_TIMEOUT);
        switch (dwRes)
        {
        case EC_E_NOERROR:
        case EC_E_BUSCONFIG_MISMATCH:
        case EC_E_LINE_CROSSED:
            PrintSlaveInfos(INSTANCE_MASTER_DEFAULT, poLog);
            break;
        default:
            LogError("Cannot scan bus: %s (0x%lx)", ecatGetText(dwRes), dwRes);
            break;
        }
    }

    /* Print MAC address */
    if (nVerbose > 0)
    {
        ETHERNET_ADDRESS oSrcMacAddress;

        dwRes = ecatGetSrcMacAddress(&oSrcMacAddress);
        if (EC_E_NOERROR != dwRes)
        {
            LogError("Cannot get MAC address! (Result = 0x%x)", dwRes);
        }
        LogMsg("EtherCAT network adapter MAC: %02X-%02X-%02X-%02X-%02X-%02X\n",
            oSrcMacAddress.b[0], oSrcMacAddress.b[1], oSrcMacAddress.b[2], oSrcMacAddress.b[3], oSrcMacAddress.b[4], oSrcMacAddress.b[5]);
    }
    
    /* Start EtherCAT bus --> set Master state to OPERATIONAL if ENI file provided */
    /*******************************************************************************/
    if (0 != nVerbose) LogMsg( "=====================" );
    if (0 != nVerbose) LogMsg( "Start EtherCAT Master" );
    if (0 != nVerbose) LogMsg( "=====================" );

    /* set master and bus state to INIT */
    dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_INIT);
    pNotification->ProcessNotificationJobs();
    if (EC_E_NOERROR != dwRes)
    {
        LogError("Cannot start set master state to INIT (Result = %s (0x%lx))", ecatGetText(dwRes), dwRes);
        dwRetVal = dwRes;
        goto Exit;
    }

    /******************************************************/
    /* Demo code: Remove/change this in your application  */
    /******************************************************/
    dwRes = myAppPrepare(poLog, nVerbose);
    if (EC_E_NOERROR != dwRes)
    {
        LogError((EC_T_CHAR*)"myAppPrepare failed, error code: 0x%x", dwRes);
        dwRetVal = dwRes;
        goto Exit;
    }
    /* set master and bus state to PREOP */
    dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_PREOP);
    pNotification->ProcessNotificationJobs();
    if (EC_E_NOERROR != dwRes)
    {
        LogError("Cannot start set master state to PREOP (Result = %s (0x%lx))", ecatGetText(dwRes), dwRes);
        dwRetVal = dwRes;
        goto Exit;
    }
    /* skip this step if demo started without ENI */
    if (pbyCnfData != EC_NULL)
    {
        /******************************************************/
        /* Demo code: Remove/change this in your application  */
        /******************************************************/
        dwRes = myAppSetup(poLog, nVerbose, S_dwClntId);
        if (EC_E_NOERROR != dwRes)
        {
            LogError((EC_T_CHAR*)"myAppSetup failed, error code: 0x%x", dwRes);
            dwRetVal = dwRes;
            goto Exit;
        }
        /* set master and bus state to SAFEOP */
        dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_SAFEOP);
        pNotification->ProcessNotificationJobs();
        if (EC_E_NOERROR != dwRes)
        {
            LogError("Cannot start set master state to SAFEOP (Result = %s (0x%lx))", ecatGetText(dwRes), dwRes);

            /* most of the time SAFEOP is not reachable due to DCM */
            if (eDcmMode_Off != eDcmMode)
            {
            EC_T_DWORD dwDcmStatus = 0;
            EC_T_INT   nDiffCur = 0, nDiffAvg = 0, nDiffMax = 0;

                dwRes = ecatDcmGetStatus(&dwDcmStatus, &nDiffCur, &nDiffAvg, &nDiffMax);
                if (dwRes == EC_E_NOERROR)
                {
                    if (dwDcmStatus != EC_E_NOERROR)
                    {
                        LogError("DCM Status: %s (0x%08X)\n", ecatGetText(dwDcmStatus), dwDcmStatus);
                    }
                }
                else
                {
                    LogError("Cannot get DCM status! %s (0x%08X)\n", ecatGetText(dwRes), dwRes);
                }
            }
            dwRetVal = dwRes;
            goto Exit;
        }
        /* set master and bus state to OP */
        dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_OP);
        pNotification->ProcessNotificationJobs();
        if (EC_E_NOERROR != dwRes)
        {
            LogError("Cannot start set master state to OP (Result = %s (0x%lx))", ecatGetText(dwRes), dwRes);
            dwRetVal = dwRes;
            goto Exit;
        }
    }
    else
    {
        if (0 != nVerbose) LogMsg("No ENI file provided. EC-Master started with generated ENI file.");
    }

    if (S_bEnaPerfJobs)
    {
        LogMsg("");
        LogMsg("Job times during startup <INIT> to <%s>:", ecatStateToStr(ecatGetMasterState()));
        PERF_MEASURE_JOBS_SHOW();       /* show job times */
        LogMsg("");
        ecatPerfMeasReset(&S_TscMeasDesc, 0xFFFFFFFF);        /* clear job times of startup phase */
    }

#if (defined DEBUG) && (defined XENOMAI)
    /* Enabling mode switch warnings for shadowed task */
    dwRes = rt_task_set_mode(0, T_WARNSW, NULL);
    if (0 != dwRes)
    {
        OsDbgMsg("EnableRealtimeEnvironment: rt_task_set_mode returned an error\n");
        OsDbgAssert(EC_FALSE);
    }
#endif

    /* run the demo */
    if (dwDuration != 0)
    {
        oTimeout.Start(dwDuration);
    }
    while (bRun && (!oTimeout.IsStarted() || !oTimeout.IsElapsed()))
    {
        if (nVerbose >= 2)
        {
            PERF_MEASURE_JOBS_SHOW();       /* show job times */
        }
        bRun = !OsTerminateAppRequest();/* check if demo shall terminate */

        /*****************************************************************************************/
        /* Demo code: Remove/change this in your application: Do some diagnosis outside job task */
        /*****************************************************************************************/
        myAppDiagnosis(poLog, nVerbose);

        /* check DCM status if master is started with ENI */
        if (pbyCnfData != EC_NULL)
        {
            if (eDcmMode_Off != eDcmMode)
            {
            EC_T_DWORD dwDcmStatus = 0;
            EC_T_INT   nDiffCur = 0, nDiffAvg = 0, nDiffMax = 0;
            EC_T_BOOL  bLogDcmStatus = EC_FALSE;
            EC_T_BOOL  bResetDcmStatus = bFirstDcmStatus;

                if (!oDcmStatusTimer.IsStarted() || oDcmStatusTimer.IsElapsed())
                {
                    oDcmStatusTimer.Start(5000);
                    if (nVerbose >= 3)
                    {
                        bLogDcmStatus = EC_TRUE;
                    }
                }
                dwRes = ecatDcmGetStatus(&dwDcmStatus, &nDiffCur, &nDiffAvg, &nDiffMax);
                if (dwRes == EC_E_NOERROR)
                {
                    if (bFirstDcmStatus)
                    {
                        LogMsg("DCM during startup (<INIT> to <%s>)", ecatStateToStr(ecatGetMasterState()));
                    }
                    if ((dwDcmStatus != EC_E_NOTREADY) && (dwDcmStatus != EC_E_BUSY) && (dwDcmStatus != EC_E_NOERROR))
                    {
                        LogMsg("DCM Status: %s (0x%08X)\n", ecatGetText(dwDcmStatus), dwDcmStatus);
                    }
                    if (bLogDcmStatus)
                    {
                        LogMsg("DCM Diff(ns): Cur=%7d, Avg=%7d, Max=%7d", nDiffCur, nDiffAvg, nDiffMax);
                    }
                }
                else
                {
                    if ((eEcatState_OP == ecatGetMasterState()) || (eEcatState_SAFEOP == ecatGetMasterState()))
                    {
                        LogError("Cannot get DCM status! %s (0x%08X)\n", ecatGetText(dwRes), dwRes);
                    }
                    bResetDcmStatus = EC_FALSE;
                }
                if (eDcmMode_Dcx == eDcmMode)
                {
                EC_T_INT64 nTimeStampDiff = 0;

                    dwRes = ecatDcxGetStatus(&dwDcmStatus, &nDiffCur, &nDiffAvg, &nDiffMax, &nTimeStampDiff);
                    if (EC_E_NOERROR == dwRes)
                    {
                        if (bFirstDcmStatus)
                        {
                            LogMsg("DCX during startup (<INIT> to <%s>)", ecatStateToStr(ecatGetMasterState()));
                        }
                        if ((dwDcmStatus != EC_E_NOTREADY) && (dwDcmStatus != EC_E_BUSY) && (dwDcmStatus != EC_E_NOERROR))
                        {
                            LogMsg("DCX Status: %s (0x%08X)\n", ecatGetText(dwDcmStatus), dwDcmStatus);
                        }
                        if (bLogDcmStatus)
                        {
                            LogMsg("DCX Diff(ns): Cur=%7d, Avg=%7d, Max=%7d, TimeStamp=%7d", nDiffCur, nDiffAvg, nDiffMax, nTimeStampDiff);
                        }
                    }
                    else
                    {
                        if ((eEcatState_OP == ecatGetMasterState()) || (eEcatState_SAFEOP == ecatGetMasterState()))
                        {
                            LogError("Cannot get DCX status! %s (0x%08X)\n", ecatGetText(dwRes), dwRes);
                        }
                        bResetDcmStatus = EC_FALSE;
                    }
                }
                if (bResetDcmStatus)
                {
#if (defined ATECAT_VERSION) && (ATECAT_VERSION >= 0x02040106)
                    ecatDcmResetStatus();
#endif
                    bFirstDcmStatus = EC_FALSE;
                }
            }
        }
        /* process notification jobs */
        pNotification->ProcessNotificationJobs();

        OsSleep(5);
    }

    if (S_bEnaPerfJobs)
    {
        LogMsg("");
        LogMsg("Job times before shutdown");
        PERF_MEASURE_JOBS_SHOW();       /* show job times */
    }

Exit:
    if (0 != nVerbose) LogMsg( "========================" );
    if (0 != nVerbose) LogMsg( "Shutdown EtherCAT Master" );
    if (0 != nVerbose) LogMsg( "========================" );

    /* Stop EtherCAT bus --> Set Master state to INIT */
    dwRes = ecatSetMasterState(ETHERCAT_STATE_CHANGE_TIMEOUT, eEcatState_INIT);
    if (EC_E_NOERROR != dwRes)
    {
        LogError("Cannot stop EtherCAT-Master! %s (0x%lx)", ecatGetText(dwRes), dwRes);
    }
    /* Unregister client */
    if (S_dwClntId != 0)
    {
        dwRes = ecatUnregisterClient(S_dwClntId); 
        if (EC_E_NOERROR != dwRes)
        {
            LogError("Cannot unregister client! %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        S_dwClntId = 0;
    }

#if (defined DEBUG) && (defined XENOMAI)
    /* Disable PRIMARY to SECONDARY MODE switch warning */
    dwRes = rt_task_set_mode(T_WARNSW, 0, NULL);
    if (dwRes != 0)
    {
        OsDbgMsg("OsCreateThread: rt_task_set_mode returned error %d\n", dwRes);
        OsDbgAssert(EC_FALSE);
    }
#endif /* XENOMAI */

    /* Shutdown tEcJobTask */
    S_DemoThreadParam.bJobThreadShutdown = EC_TRUE;
    oTimeout.Start(2000);
    while (S_DemoThreadParam.bJobThreadRunning && !oTimeout.IsElapsed())
    {
        OsSleep(10);
    }
    if (S_pvtJobThread != EC_NULL)
    {
        OsDeleteThreadHandle(S_pvtJobThread);
        S_pvtJobThread = EC_NULL;
    }

#ifdef ATEMRAS_SERVER
    /* Stop RAS server */
    if (S_bRasSrvStarted)
    {
        LogMsg("Stop Remote Api Server\n");
        
        if (EC_E_NOERROR != emRasSrvStop(S_pvRemoteApiSrvH, 2000))
        {
            LogError("Remote API Server shutdown failed\n");
        }
    }
#endif

    /* Deinitialize master */
    LogMsg( "ecatDeinitMaster() should be called here." );
    LogMsg( "But this would provoke a ' double free or corruption (out):' error." );
//     dwRes = ecatDeinitMaster();
    
    if (EC_E_NOERROR != dwRes)
    {
        LogError("Cannot de-initialize EtherCAT-Master! %s (0x%lx)", ecatGetText(dwRes), dwRes);
    }

    if (S_bEnaPerfJobs)
    {
        PERF_MEASURE_JOBS_DEINIT();
    }
    /* delete notification context */
    SafeDelete(pNotification);

    return dwRetVal;
}